

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  pointer pcVar1;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar2;
  pointer puVar3;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var4;
  Option *pOVar5;
  string *__rhs;
  OptionAlreadyAdded *pOVar6;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_00;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar7;
  Option myopt;
  string local_388;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *local_368;
  string local_360;
  string local_340;
  string local_320;
  _Any_data local_300;
  code *local_2f0;
  _Any_data local_2e0;
  code *local_2d0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  Option local_280;
  
  pcVar1 = (option_name->_M_dataplus)._M_p;
  local_368 = func;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar1,pcVar1 + option_name->_M_string_length);
  pcVar1 = (option_description->_M_dataplus)._M_p;
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_340,pcVar1,pcVar1 + option_description->_M_string_length);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_2e0,option_callback);
  Option::Option(&local_280,&local_320,&local_340,(callback_t *)&local_2e0,this);
  if (local_2d0 != (code *)0x0) {
    (*local_2d0)(&local_2e0,&local_2e0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_280);
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current == puVar2) {
    std::
    vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ::emplace_back<>(&this->options_);
    puVar3 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pOVar5 = (Option *)operator_new(0x250);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    pcVar1 = (option_name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,pcVar1,pcVar1 + option_name->_M_string_length);
    pcVar1 = (option_description->_M_dataplus)._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar1,pcVar1 + option_description->_M_string_length);
    std::
    function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_300,option_callback);
    Option::Option(pOVar5,&local_388,&local_360,(callback_t *)&local_300,this);
    this_00 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar3 + -1);
    std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,pOVar5);
    if (local_2f0 != (code *)0x0) {
      (*local_2f0)(&local_300,&local_300,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=(&((this_00->_M_t).
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->default_function_,
              local_368);
    if (defaulted) {
      Option::capture_default_str
                ((this_00->_M_t).
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    }
    OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
              (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
               (this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    if ((!defaulted) &&
       (pOVar5 = (this_00->_M_t).
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
       (pOVar5->super_OptionBase<CLI::Option>).always_capture_default_ == true)) {
      Option::capture_default_str(pOVar5);
    }
    pOVar5 = (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    Option::~Option(&local_280);
    return pOVar5;
  }
  puVar7 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != puVar2) {
    do {
      __rhs = Option::matching_name_abi_cxx11_
                        ((puVar7->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_280);
      if (__rhs->_M_string_length != 0) {
        pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_2a0,"added option matched existing option name: ",__rhs);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,&local_2a0);
        __cxa_throw(pOVar6,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"added option matched existing option name","");
  OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,&local_2c0);
  __cxa_throw(pOVar6,&OptionAlreadyAdded::typeinfo,Error::~Error);
}

Assistant:

Option *add_option(std::string option_name,
                       callback_t option_callback,
                       std::string option_description = "",
                       bool defaulted = false,
                       std::function<std::string()> func = {}) {
        Option myopt{option_name, option_description, option_callback, this};

        if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) {
               return *v == myopt;
           }) == std::end(options_)) {
            options_.emplace_back();
            Option_p &option = options_.back();
            option.reset(new Option(option_name, option_description, option_callback, this));

            // Set the default string capture function
            option->default_function(func);

            // For compatibility with CLI11 1.7 and before, capture the default string here
            if(defaulted)
                option->capture_default_str();

            // Transfer defaults to the new option
            option_defaults_.copy_to(option.get());

            // Don't bother to capture if we already did
            if(!defaulted && option->get_always_capture_default())
                option->capture_default_str();

            return option.get();
        }
        // we know something matches now find what it is so we can produce more error information
        for(auto &opt : options_) {
            auto &matchname = opt->matching_name(myopt);
            if(!matchname.empty()) {
                throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
            }
        }
        // this line should not be reached the above loop should trigger the throw
        throw(OptionAlreadyAdded("added option matched existing option name"));  // LCOV_EXCL_LINE
    }